

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O0

void cftfsub(int n,float *a,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  float *in_RDX;
  float *in_RSI;
  int in_EDI;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  int l;
  int j3;
  int j2;
  int j1;
  int j;
  int local_2c;
  int local_1c;
  
  local_2c = 2;
  if (8 < in_EDI) {
    cft1st(in_EDI,in_RSI,in_RDX);
    for (local_2c = 8; local_2c * 4 < in_EDI; local_2c = local_2c << 2) {
      cftmdl(in_EDI,local_2c,in_RSI,in_RDX);
    }
  }
  if (local_2c << 2 == in_EDI) {
    for (local_1c = 0; local_1c < local_2c; local_1c = local_1c + 2) {
      iVar17 = local_1c + local_2c;
      iVar18 = iVar17 + local_2c;
      iVar19 = iVar18 + local_2c;
      fVar1 = in_RSI[local_1c];
      fVar2 = in_RSI[iVar17];
      fVar3 = in_RSI[local_1c + 1];
      fVar4 = in_RSI[iVar17 + 1];
      fVar5 = in_RSI[local_1c];
      fVar6 = in_RSI[iVar17];
      fVar7 = in_RSI[local_1c + 1];
      fVar8 = in_RSI[iVar17 + 1];
      fVar9 = in_RSI[iVar18];
      fVar10 = in_RSI[iVar19];
      fVar11 = in_RSI[iVar18 + 1];
      fVar12 = in_RSI[iVar19 + 1];
      fVar13 = in_RSI[iVar18];
      fVar14 = in_RSI[iVar19];
      fVar15 = in_RSI[iVar18 + 1];
      fVar16 = in_RSI[iVar19 + 1];
      in_RSI[local_1c] = fVar1 + fVar2 + fVar9 + fVar10;
      in_RSI[local_1c + 1] = fVar3 + fVar4 + fVar11 + fVar12;
      in_RSI[iVar18] = (fVar1 + fVar2) - (fVar9 + fVar10);
      in_RSI[iVar18 + 1] = (fVar3 + fVar4) - (fVar11 + fVar12);
      in_RSI[iVar17] = (fVar5 - fVar6) - (fVar15 - fVar16);
      in_RSI[iVar17 + 1] = (fVar7 - fVar8) + (fVar13 - fVar14);
      in_RSI[iVar19] = (fVar5 - fVar6) + (fVar15 - fVar16);
      in_RSI[iVar19 + 1] = (fVar7 - fVar8) - (fVar13 - fVar14);
    }
  }
  else {
    for (local_1c = 0; local_1c < local_2c; local_1c = local_1c + 2) {
      iVar17 = local_1c + local_2c;
      fVar1 = in_RSI[local_1c];
      fVar2 = in_RSI[iVar17];
      fVar3 = in_RSI[local_1c + 1];
      fVar4 = in_RSI[iVar17 + 1];
      in_RSI[local_1c] = in_RSI[iVar17] + in_RSI[local_1c];
      in_RSI[local_1c + 1] = in_RSI[iVar17 + 1] + in_RSI[local_1c + 1];
      in_RSI[iVar17] = fVar1 - fVar2;
      in_RSI[iVar17 + 1] = fVar3 - fVar4;
    }
  }
  return;
}

Assistant:

void cftfsub(int n, float *a, float *w)
{
    void cft1st(int n, float *a, float *w);
    void cftmdl(int n, int l, float *a, float *w);
    int j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}